

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layers.h
# Opt level: O3

void __thiscall
dlib::add_prev_<dlib::tag1>::
forward<dlib::dimpl::subnet_wrapper<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<1024l,1l,1l,1,1,0,0>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,3l,3l,1,1,1,1>,dlib::add_layer<dlib::relu_,dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,dlib::add_layer<dlib::con_<256l,1l,1l,1,1,0,0>,dlib::add_tag_layer<1ul,dlib::impl::repeat_input_layer,void>,void>,void>,void>,void>,void>,void>,void>,void>,true,void>>
          (add_prev_<dlib::tag1> *this,
          subnet_wrapper<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_true,_void>
          *sub,resizable_tensor *output)

{
  undefined1 auVar1 [32];
  add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void> *paVar2;
  add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<1024L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<256L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>,_void>
  *paVar3;
  tensor *ptVar4;
  tensor *src2;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  size_t new_size;
  
  paVar2 = ((subnet_wrapper<dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_false,_void>
             *)((long)&(sub->subnetwork).subnetwork.subnetwork.subnetwork.subnetwork.subnetwork.
                       subnetwork + 8))->l;
  paVar3 = sub->l;
  ptVar4 = paVar2->cached_output_ptr;
  auVar7._0_8_ = (paVar3->cached_output).super_tensor.m_n;
  auVar7._8_8_ = (paVar3->cached_output).super_tensor.m_k;
  auVar7._16_8_ = (paVar3->cached_output).super_tensor.m_nr;
  auVar7._24_8_ = (paVar3->cached_output).super_tensor.m_nc;
  src2 = &(paVar2->cached_output).super_tensor;
  if (ptVar4 != (tensor *)0x0) {
    src2 = ptVar4;
  }
  auVar1._0_8_ = src2->m_n;
  auVar1._8_8_ = src2->m_k;
  auVar1._16_8_ = src2->m_nr;
  auVar1._24_8_ = src2->m_nc;
  auVar7 = vpmaxsq_avx512vl(auVar7,auVar1);
  (output->super_tensor).m_n = auVar7._0_8_;
  (output->super_tensor).m_k = auVar7._8_8_;
  (output->super_tensor).m_nr = auVar7._16_8_;
  (output->super_tensor).m_nc = auVar7._24_8_;
  auVar5 = vpmullq_avx512vl(auVar7._0_16_,auVar7._16_16_);
  auVar6 = vpshufd_avx(auVar5,0xee);
  auVar6 = vpmullq_avx512vl(auVar5,auVar6);
  new_size = auVar6._0_8_;
  (output->super_tensor).m_size = new_size;
  if ((long)(output->data_instance).data_size < (long)new_size) {
    gpu_data::set_size(&output->data_instance,new_size);
  }
  tt::add(&output->super_tensor,&(paVar3->cached_output).super_tensor,src2);
  return;
}

Assistant:

void forward(const SUBNET& sub, resizable_tensor& output)
        {
            auto&& t1 = sub.get_output();
            auto&& t2 = layer<tag>(sub).get_output();
            output.set_size(std::max(t1.num_samples(),t2.num_samples()),
                            std::max(t1.k(),t2.k()),
                            std::max(t1.nr(),t2.nr()),
                            std::max(t1.nc(),t2.nc()));
            tt::add(output, t1, t2);
        }